

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O2

void loader_impl_configuration_execution_paths(loader_impl_interface iface,loader_impl impl)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *__src;
  size_t __n;
  long lVar4;
  loader_path execution_path;
  
  lVar2 = configuration_value_type(impl->config,"execution_paths",9);
  if (lVar2 != 0) {
    lVar3 = value_type_count(lVar2);
    lVar2 = value_to_array(lVar2);
    for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
      iVar1 = value_type_id(*(undefined8 *)(lVar2 + lVar4 * 8));
      if (iVar1 == 7) {
        __src = (char *)value_to_string(*(undefined8 *)(lVar2 + lVar4 * 8));
        __n = value_type_size(*(undefined8 *)(lVar2 + lVar4 * 8));
        if (__src != (char *)0x0) {
          if (0xfff < __n) {
            __n = 0x1000;
          }
          strncpy(execution_path,__src,__n);
          (*iface->execution_path)(impl,execution_path);
        }
      }
    }
  }
  return;
}

Assistant:

void loader_impl_configuration_execution_paths(loader_impl_interface iface, loader_impl impl)
{
	value execution_paths_value = configuration_value_type(impl->config, "execution_paths", TYPE_ARRAY);

	if (execution_paths_value != NULL)
	{
		size_t size = value_type_count(execution_paths_value);
		value *execution_paths_array = value_to_array(execution_paths_value);
		size_t iterator;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_type_id(execution_paths_array[iterator]) == TYPE_STRING)
			{
				const char *str = value_to_string(execution_paths_array[iterator]);
				size_t str_size = value_type_size(execution_paths_array[iterator]);

				if (str != NULL)
				{
					loader_path execution_path;

					strncpy(execution_path, str, str_size > LOADER_PATH_SIZE ? LOADER_PATH_SIZE : str_size);

					iface->execution_path(impl, execution_path);
				}
			}
		}
	}
}